

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86_avx512.cpp
# Opt level: O0

int ncnn::binary_op_scalar<ncnn::BinaryOp_x86_avx512_functor::binary_op_rdiv>
              (Mat *a,float b,Mat *c,Option *opt)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  binary_op_rdiv *in_RSI;
  binary_op_rdiv *this;
  long *in_RDI;
  float in_XMM0_Da;
  float fVar3;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined1 auVar4 [32];
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  __m128 afVar13;
  __m128 _p_2;
  __m128 _b;
  __m256 _p_1;
  __m256 _b_avx;
  __m512 _p;
  __m512 _b_avx512;
  int i;
  float *outptr;
  float *ptr;
  int q;
  int size;
  int channels;
  binary_op_rdiv op;
  Mat *m;
  Mat *m_1;
  __m256 *in_stack_fffffffffffffa80;
  undefined4 in_stack_fffffffffffffa88;
  __m512 *in_stack_fffffffffffffaa0;
  __m512 *x;
  binary_op_rdiv *this_00;
  float local_520 [2];
  float afStack_518 [2];
  float local_510 [4];
  undefined8 local_500;
  undefined8 uStack_4f8;
  undefined8 uStack_4f0;
  undefined8 uStack_4e8;
  undefined8 local_4e0;
  undefined8 uStack_4d8;
  undefined8 uStack_4d0;
  undefined8 uStack_4c8;
  undefined8 local_4c0;
  undefined8 uStack_4b8;
  undefined8 uStack_4b0;
  undefined8 uStack_4a8;
  undefined8 uStack_4a0;
  undefined8 uStack_498;
  undefined8 uStack_490;
  undefined8 uStack_488;
  undefined8 local_480;
  undefined8 uStack_478;
  undefined8 uStack_470;
  undefined8 uStack_468;
  undefined8 uStack_460;
  undefined8 uStack_458;
  undefined8 uStack_450;
  undefined8 uStack_448;
  int local_434;
  float local_430 [8];
  long local_410;
  float local_408;
  float local_404;
  float local_400;
  float local_3fc;
  float local_3f8;
  undefined8 local_3f0;
  binary_op_rdiv *local_3e8;
  undefined8 local_3e0;
  undefined8 local_3d8;
  undefined8 local_3d0;
  undefined4 local_3c8;
  long local_3c0;
  undefined4 local_3b8;
  undefined4 local_3b4;
  undefined4 local_3b0;
  undefined4 local_3ac;
  undefined4 local_3a8;
  undefined8 local_3a0;
  float *local_398;
  int local_390;
  int local_38c;
  int local_388;
  binary_op_rdiv local_381 [9];
  binary_op_rdiv *local_378;
  float local_36c;
  long *local_368;
  undefined1 local_35d;
  int local_35c;
  undefined8 *local_350;
  undefined8 *local_348;
  undefined8 *local_338;
  float *local_330;
  undefined1 local_325;
  int local_324;
  float *local_318;
  float *local_308;
  undefined1 local_300 [64];
  float *local_288;
  undefined8 local_280;
  undefined8 uStack_278;
  undefined8 uStack_270;
  undefined8 uStack_268;
  undefined8 uStack_260;
  undefined8 uStack_258;
  undefined8 uStack_250;
  undefined8 uStack_248;
  binary_op_rdiv *local_218;
  float local_20c;
  float *local_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  binary_op_rdiv *local_1d8;
  float local_1d0;
  float fStack_1cc;
  float fStack_1c8;
  float fStack_1c4;
  float local_1bc;
  float *local_1b8;
  float local_1b0 [2];
  float afStack_1a8 [4];
  binary_op_rdiv *local_198;
  long local_190;
  undefined4 local_184;
  long local_180;
  binary_op_rdiv *local_178;
  undefined4 local_16c;
  int local_168;
  int local_164;
  __m512 *local_160;
  long local_158;
  undefined4 local_14c;
  long local_148;
  float *local_140;
  undefined4 local_134;
  int local_130;
  int local_12c;
  undefined8 *local_128;
  undefined4 local_11c;
  long local_118;
  undefined4 local_10c;
  long local_108;
  float *local_e8;
  undefined8 *local_d8;
  undefined1 local_a0 [32];
  float local_70;
  float local_6c;
  float local_68;
  float local_64;
  float local_60;
  float local_5c;
  float local_58;
  float local_54;
  
  local_388 = (int)in_RDI[7];
  local_38c = *(int *)((long)in_RDI + 0x2c) * (int)in_RDI[6] * *(int *)((long)in_RDI + 0x34) *
              (int)in_RDI[3];
  local_378 = in_RSI;
  local_36c = in_XMM0_Da;
  local_368 = in_RDI;
  for (local_390 = 0; local_390 < local_388; local_390 = local_390 + 1) {
    local_350 = &local_3e0;
    local_12c = *(int *)((long)local_368 + 0x2c);
    local_130 = (int)local_368[6];
    local_134 = *(undefined4 *)((long)local_368 + 0x34);
    local_398 = (float *)(*local_368 + local_368[8] * (long)local_390 * local_368[2]);
    local_148 = local_368[2];
    local_14c = (undefined4)local_368[3];
    local_158 = local_368[4];
    local_128 = &local_3e0;
    local_118 = (long)local_12c * (long)local_130 * local_148;
    local_348 = &local_3e0;
    local_338 = &local_3e0;
    local_318 = local_430;
    local_164 = *(int *)(local_378 + 0x2c);
    local_168 = *(int *)(local_378 + 0x30);
    local_16c = *(undefined4 *)(local_378 + 0x34);
    this = (binary_op_rdiv *)
           (*(long *)local_378 +
           *(long *)(local_378 + 0x40) * (long)local_390 * *(long *)(local_378 + 0x10));
    local_180 = *(long *)(local_378 + 0x10);
    local_184 = *(undefined4 *)(local_378 + 0x18);
    local_190 = *(long *)(local_378 + 0x20);
    x = (__m512 *)local_430;
    local_108 = (long)local_164 * (long)local_168 * local_180;
    local_308 = local_430;
    local_330 = local_430;
    local_3a8 = 0;
    local_3ac = 0;
    local_3b0 = 0;
    local_3b4 = 0;
    local_3c8 = 0;
    local_3d0 = 0;
    local_3d8 = 0;
    local_3e0 = 0;
    local_10c = 0x10;
    local_11c = 0x10;
    local_324 = local_390;
    local_325 = 1;
    local_35c = local_390;
    local_35d = 1;
    local_3a0 = 0;
    local_3b8 = 0;
    local_430[0] = 0.0;
    local_430[1] = 0.0;
    local_430[4] = 0.0;
    local_430[5] = 0.0;
    local_430[6] = 0.0;
    local_408 = 0.0;
    local_404 = 0.0;
    local_400 = 0.0;
    local_3fc = 0.0;
    local_3f8 = 0.0;
    local_3f0 = 0;
    local_430[2] = 0.0;
    local_430[3] = 0.0;
    local_434 = 0;
    local_300 = vbroadcastss_avx512f(ZEXT416((uint)local_36c));
    local_480 = local_300._0_8_;
    uStack_478 = local_300._8_8_;
    uStack_470 = local_300._16_8_;
    uStack_468 = local_300._24_8_;
    uStack_460 = local_300._32_8_;
    uStack_458 = local_300._40_8_;
    uStack_450 = local_300._48_8_;
    uStack_448 = local_300._56_8_;
    this_00 = local_378;
    local_3e8 = this;
    local_178 = this;
    local_160 = x;
    local_140 = local_398;
    local_e8 = local_330;
    local_d8 = local_338;
    local_410 = local_190;
    local_3c0 = local_158;
    for (; local_434 + 0xf < local_38c; local_434 = local_434 + 0x10) {
      local_288 = local_398;
      uVar6 = *(undefined8 *)local_398;
      uVar5 = *(undefined8 *)(local_398 + 2);
      uVar7 = *(undefined8 *)(local_398 + 4);
      uVar8 = *(undefined8 *)(local_398 + 6);
      uVar9 = *(undefined8 *)(local_398 + 8);
      uVar10 = *(undefined8 *)(local_398 + 10);
      uVar11 = *(undefined8 *)(local_398 + 0xc);
      uVar12 = *(undefined8 *)(local_398 + 0xe);
      local_4c0 = uVar6;
      uStack_4b8 = uVar5;
      uStack_4b0 = uVar7;
      uStack_4a8 = uVar8;
      uStack_4a0 = uVar9;
      uStack_498 = uVar10;
      uStack_490 = uVar11;
      uStack_488 = uVar12;
      BinaryOp_x86_avx512_functor::binary_op_rdiv::func_pack16(this_00,x,in_stack_fffffffffffffaa0);
      local_218 = local_3e8;
      *(undefined8 *)local_3e8 = uVar6;
      *(undefined8 *)(local_3e8 + 8) = uVar5;
      *(undefined8 *)(local_3e8 + 0x10) = uVar7;
      *(undefined8 *)(local_3e8 + 0x18) = uVar8;
      *(undefined8 *)(local_3e8 + 0x20) = uVar9;
      *(undefined8 *)(local_3e8 + 0x28) = uVar10;
      *(undefined8 *)(local_3e8 + 0x30) = uVar11;
      *(undefined8 *)(local_3e8 + 0x38) = uVar12;
      local_398 = local_398 + 0x10;
      local_3e8 = local_3e8 + 0x40;
      local_4c0 = uVar6;
      uStack_4b8 = uVar5;
      uStack_4b0 = uVar7;
      uStack_4a8 = uVar8;
      uStack_4a0 = uVar9;
      uStack_498 = uVar10;
      uStack_490 = uVar11;
      uStack_488 = uVar12;
      local_280 = uVar6;
      uStack_278 = uVar5;
      uStack_270 = uVar7;
      uStack_268 = uVar8;
      uStack_260 = uVar9;
      uStack_258 = uVar10;
      uStack_250 = uVar11;
      uStack_248 = uVar12;
    }
    local_20c = local_36c;
    local_54 = local_36c;
    local_58 = local_36c;
    local_5c = local_36c;
    local_60 = local_36c;
    local_64 = local_36c;
    local_68 = local_36c;
    local_6c = local_36c;
    local_70 = local_36c;
    auVar1 = vinsertps_avx(ZEXT416((uint)local_36c),ZEXT416((uint)local_36c),0x10);
    auVar1 = vinsertps_avx(auVar1,ZEXT416((uint)local_36c),0x20);
    auVar1 = vinsertps_avx(auVar1,ZEXT416((uint)local_36c),0x30);
    auVar2 = vinsertps_avx(ZEXT416((uint)local_36c),ZEXT416((uint)local_36c),0x10);
    auVar2 = vinsertps_avx(auVar2,ZEXT416((uint)local_36c),0x20);
    auVar2 = vinsertps_avx(auVar2,ZEXT416((uint)local_36c),0x30);
    auVar4._16_16_ = auVar1;
    auVar4._0_16_ = auVar2;
    local_a0._0_8_ = auVar2._0_8_;
    local_a0._8_8_ = auVar2._8_8_;
    local_a0._16_8_ = auVar1._0_8_;
    local_a0._24_8_ = auVar1._8_8_;
    local_4e0 = local_a0._0_8_;
    uStack_4d8 = local_a0._8_8_;
    uStack_4d0 = local_a0._16_8_;
    uStack_4c8 = local_a0._24_8_;
    fVar3 = local_36c;
    local_a0 = auVar4;
    for (; local_434 + 7 < local_38c; local_434 = local_434 + 8) {
      local_208 = local_398;
      uVar6 = *(undefined8 *)local_398;
      uVar5 = *(undefined8 *)(local_398 + 2);
      uVar7 = *(undefined8 *)(local_398 + 4);
      uVar8 = *(undefined8 *)(local_398 + 6);
      local_500 = uVar6;
      uStack_4f8 = uVar5;
      uStack_4f0 = uVar7;
      uStack_4e8 = uVar8;
      BinaryOp_x86_avx512_functor::binary_op_rdiv::func_pack8
                (this,(__m256 *)CONCAT44(fVar3,in_stack_fffffffffffffa88),in_stack_fffffffffffffa80)
      ;
      local_1d8 = local_3e8;
      *(undefined8 *)local_3e8 = uVar6;
      *(undefined8 *)(local_3e8 + 8) = uVar5;
      *(undefined8 *)(local_3e8 + 0x10) = uVar7;
      *(undefined8 *)(local_3e8 + 0x18) = uVar8;
      local_398 = local_398 + 8;
      local_3e8 = local_3e8 + 0x20;
      local_500 = uVar6;
      uStack_4f8 = uVar5;
      uStack_4f0 = uVar7;
      uStack_4e8 = uVar8;
      local_200 = uVar6;
      uStack_1f8 = uVar5;
      uStack_1f0 = uVar7;
      uStack_1e8 = uVar8;
    }
    local_1bc = local_36c;
    local_1d0 = local_36c;
    fStack_1cc = local_36c;
    fStack_1c8 = local_36c;
    fStack_1c4 = local_36c;
    for (; local_434 + 3 < local_38c; local_434 = local_434 + 4) {
      local_1b8 = local_398;
      local_520 = *(float (*) [2])local_398;
      uVar6 = *(undefined8 *)(local_398 + 2);
      afStack_518 = (float  [2])uVar6;
      afVar13 = BinaryOp_x86_avx512_functor::binary_op_rdiv::func_pack4
                          (local_381,(__m128 *)local_520,&local_510);
      local_520 = afVar13._0_8_;
      local_198 = local_3e8;
      *(float (*) [2])local_3e8 = local_520;
      *(undefined8 *)(local_3e8 + 8) = uVar6;
      local_398 = local_398 + 4;
      local_3e8 = local_3e8 + 0x10;
      afStack_518 = (float  [2])uVar6;
      local_1b0 = local_520;
      afStack_1a8._0_8_ = uVar6;
    }
    for (; local_434 < local_38c; local_434 = local_434 + 1) {
      fVar3 = BinaryOp_x86_avx512_functor::binary_op_rdiv::func(local_381,local_398,&local_36c);
      *(float *)local_3e8 = fVar3;
      local_398 = local_398 + 1;
      local_3e8 = local_3e8 + 4;
    }
  }
  return 0;
}

Assistant:

static int binary_op_scalar(const Mat& a, float b, Mat& c, const Option& opt)
{
    Op op;

    const int channels = a.c;
    const int size = a.w * a.h * a.d * a.elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        const float* ptr = a.channel(q);
        float* outptr = c.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        __m512 _b_avx512 = _mm512_set1_ps(b);
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            _p = op.func_pack16(_p, _b_avx512);
            _mm512_storeu_ps(outptr, _p);
            ptr += 16;
            outptr += 16;
        }
#endif // __AVX512F__
        __m256 _b_avx = _mm256_set1_ps(b);
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _p = op.func_pack8(_p, _b_avx);
            _mm256_storeu_ps(outptr, _p);
            ptr += 8;
            outptr += 8;
        }
#endif // __AVX__
        __m128 _b = _mm_set1_ps(b);
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            _p = op.func_pack4(_p, _b);
            _mm_store_ps(outptr, _p);
            ptr += 4;
            outptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *outptr = op.func(*ptr, b);
            ptr++;
            outptr++;
        }
    }

    return 0;
}